

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O0

void OPLL_initalize(YM2413 *chip)

{
  double local_20;
  int local_14;
  int i;
  YM2413 *chip_local;
  
  if (chip->rate == 0) {
    local_20 = 0.0;
  }
  else {
    local_20 = ((double)chip->clock / 72.0) / (double)chip->rate;
  }
  chip->freqbase = local_20;
  if (ABS(chip->freqbase - 1.0) < 5e-05) {
    chip->freqbase = 1.0;
  }
  for (local_14 = 0; local_14 < 0x400; local_14 = local_14 + 1) {
    chip->fn_tab[local_14] = (UINT32)(long)((double)local_14 * 64.0 * chip->freqbase * 64.0);
  }
  chip->lfo_am_inc = (UINT32)(long)(chip->freqbase * 16777216.0 * 0.015625);
  chip->lfo_pm_inc = (UINT32)(long)(chip->freqbase * 16777216.0 * 0.0009765625);
  chip->noise_f = (UINT32)(long)(chip->freqbase * 65536.0);
  chip->eg_timer_add = (UINT32)(long)(chip->freqbase * 65536.0);
  chip->eg_timer_overflow = 0x10000;
  return;
}

Assistant:

static void OPLL_initalize(YM2413 *chip)
{
	int i;

	/* frequency base */
	chip->freqbase  = (chip->rate) ? ((double)chip->clock / 72.0) / chip->rate : 0;
	if (fabs(chip->freqbase - 1.0) < 0.00005)
		chip->freqbase = 1.0;

	/* make fnumber -> increment counter table */
	for( i = 0 ; i < 1024; i++ )
	{
		/* OPLL (YM2413) phase increment counter = 18bit */

		chip->fn_tab[i] = (UINT32)( (double)i * 64 * chip->freqbase * (1<<(FREQ_SH-10)) ); /* -10 because chip works with 10.10 fixed point, while we use 16.16 */
	}

	/* Amplitude modulation: 27 output levels (triangle waveform); 1 level takes one of: 192, 256 or 448 samples */
	/* One entry from LFO_AM_TABLE lasts for 64 samples */
	chip->lfo_am_inc = (1<<LFO_SH) * chip->freqbase / 64.0;

	/* Vibrato: 8 output levels (triangle waveform); 1 level takes 1024 samples */
	chip->lfo_pm_inc = (1<<LFO_SH) * chip->freqbase / 1024.0;

	/* Noise generator: a step takes 1 sample */
	chip->noise_f = (1<<FREQ_SH) * chip->freqbase;

	chip->eg_timer_add  = (1<<EG_SH) * chip->freqbase;
	chip->eg_timer_overflow = (1<<EG_SH);
}